

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O2

vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
* xemmai::t_module::f_execute_script
            (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
             *__return_storage_ptr__,t_object *a_code)

{
  t_pvalue *ptVar1;
  t_object *ptVar2;
  t_object *ptVar3;
  long in_FS_OFFSET;
  t_fields fields;
  t_object *in_stack_ffffffffffffffa8;
  t_object *in_stack_ffffffffffffffb0;
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  vStack_40;
  
  f_new<xemmai::t_scope,xemmai::t_global>(*(t_global **)(in_FS_OFFSET + -0x78));
  ptVar2 = t_lambda::f_instantiate(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  vStack_40.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_40.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_40.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ptVar3 = f_new<xemmai::t_builder,xemmai::t_global>(*(t_global **)(in_FS_OFFSET + -0x78));
  *(undefined1 **)(ptVar3->v_data + 8) = &stack0xffffffffffffffa8;
  ptVar1 = *(t_pvalue **)(in_FS_OFFSET + -0x30);
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar1 + 2;
  ptVar1[1].super_t_pointer.v_p = ptVar3;
  (*ptVar2->v_type->f_call)(ptVar2,ptVar1,0);
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar1;
  ptVar3->v_data[8] = '\0';
  ptVar3->v_data[9] = '\0';
  ptVar3->v_data[10] = '\0';
  ptVar3->v_data[0xb] = '\0';
  ptVar3->v_data[0xc] = '\0';
  ptVar3->v_data[0xd] = '\0';
  ptVar3->v_data[0xe] = '\0';
  ptVar3->v_data[0xf] = '\0';
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::vector(__return_storage_ptr__,&vStack_40);
  t_fields::~t_fields((t_fields *)&stack0xffffffffffffffa8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<t_root, t_rvalue>> t_module::f_execute_script(t_object* a_code)
{
	auto lambda = t_lambda::f_instantiate(xemmai::f_new<t_scope>(f_global()), a_code);
	t_fields fields;
	t_builder::f_do(fields, [&](auto builder)
	{
		t_scoped_stack stack(2);
		stack[1] = builder;
		lambda->f_call_without_loop(stack, 0);
	});
	return fields.v_class;
}